

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O0

int gradient_clamp(gradient_data_t *gradient,int ipos)

{
  int local_24;
  int local_20;
  int local_1c;
  int local_14;
  int limit;
  int ipos_local;
  gradient_data_t *gradient_local;
  
  if (gradient->spread == PLUTOVG_SPREAD_METHOD_REPEAT) {
    local_1c = ipos % 0x400;
    if (local_1c < 0) {
      local_1c = local_1c + 0x400;
    }
    local_14 = local_1c;
  }
  else if (gradient->spread == PLUTOVG_SPREAD_METHOD_REFLECT) {
    local_20 = ipos % 0x800;
    if (local_20 < 0) {
      local_20 = local_20 + 0x800;
    }
    if (local_20 < 0x400) {
      local_24 = local_20;
    }
    else {
      local_24 = 0x7ff - local_20;
    }
    local_14 = local_24;
  }
  else if (ipos < 0) {
    local_14 = 0;
  }
  else {
    local_14 = ipos;
    if (0x3ff < ipos) {
      local_14 = 0x3ff;
    }
  }
  return local_14;
}

Assistant:

static inline int gradient_clamp(const gradient_data_t* gradient, int ipos)
{
    if(gradient->spread == PLUTOVG_SPREAD_METHOD_REPEAT) {
        ipos = ipos % COLOR_TABLE_SIZE;
        ipos = ipos < 0 ? COLOR_TABLE_SIZE + ipos : ipos;
    } else if(gradient->spread == PLUTOVG_SPREAD_METHOD_REFLECT) {
        const int limit = COLOR_TABLE_SIZE * 2;
        ipos = ipos % limit;
        ipos = ipos < 0 ? limit + ipos : ipos;
        ipos = ipos >= COLOR_TABLE_SIZE ? limit - 1 - ipos : ipos;
    } else {
        if(ipos < 0) {
            ipos = 0;
        } else if(ipos >= COLOR_TABLE_SIZE) {
            ipos = COLOR_TABLE_SIZE - 1;
        }
    }

    return ipos;
}